

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
readValueAttributeComplete
          (UA_Server *server,UA_VariableNode *vn,UA_TimestampsToReturn timestamps,
          UA_String *indexRange,UA_DataValue *v)

{
  code *pcVar1;
  UA_StatusCode UVar2;
  long lVar3;
  undefined4 in_register_00000014;
  UA_String *pUVar4;
  UA_String *pUVar5;
  UA_NumericRange *range_00;
  byte bVar6;
  undefined1 local_40 [8];
  UA_NumericRange range;
  
  pUVar4 = (UA_String *)CONCAT44(in_register_00000014,timestamps);
  bVar6 = 0;
  if ((pUVar4 == (UA_String *)0x0) || (pUVar4->length == 0)) {
    range_00 = (UA_NumericRange *)0x0;
  }
  else {
    range_00 = (UA_NumericRange *)local_40;
    UVar2 = parse_numericrange(pUVar4,range_00);
    if (UVar2 != 0) {
      return UVar2;
    }
  }
  if (*(int *)&(server->config).buildInfo.softwareVersion.data == 0) {
    pcVar1 = (code *)(server->config).applicationDescription.gatewayServerUri.data;
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)((server->config).applicationDescription.gatewayServerUri.length,
                &(server->config).buildInfo.buildNumber.data,range_00);
    }
    if (range_00 == (UA_NumericRange *)0x0) {
      pUVar4 = &(server->config).buildInfo.buildNumber;
      pUVar5 = indexRange;
      for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
        pUVar5->length = pUVar4->length;
        pUVar4 = (UA_String *)&pUVar4[-(ulong)bVar6].data;
        pUVar5 = (UA_String *)&pUVar5[-(ulong)bVar6].data;
      }
      *(undefined4 *)&indexRange[1].length = 1;
      return 0;
    }
    UVar2 = UA_Variant_copyRange
                      ((UA_Variant *)&(server->config).buildInfo.buildNumber.data,
                       (UA_Variant *)&indexRange->data,*range_00);
  }
  else {
    pcVar1 = (code *)(server->config).buildInfo.buildNumber.data;
    if (pcVar1 == (code *)0x0) {
      UVar2 = 0x80020000;
    }
    else {
      UVar2 = (*pcVar1)((server->config).buildInfo.buildNumber.length,((ulong)vn & 0xfffffffd) == 0,
                        range_00,indexRange);
    }
    if (range_00 == (UA_NumericRange *)0x0) {
      return UVar2;
    }
  }
  free((void *)range.dimensionsSize);
  return UVar2;
}

Assistant:

static UA_StatusCode
readValueAttributeComplete(UA_Server *server, const UA_VariableNode *vn,
                           UA_TimestampsToReturn timestamps, const UA_String *indexRange,
                           UA_DataValue *v) {
    /* Compute the index range */
    UA_NumericRange range;
    UA_NumericRange *rangeptr = NULL;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(indexRange && indexRange->length > 0) {
        retval = parse_numericrange(indexRange, &range);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        rangeptr = &range;
    }

    /* Read the value */
    if(vn->valueSource == UA_VALUESOURCE_DATA)
        retval = readValueAttributeFromNode(server, vn, v, rangeptr);
    else
        retval = readValueAttributeFromDataSource(vn, v, timestamps, rangeptr);

    /* Clean up */
    if(rangeptr)
        UA_free(range.dimensions);
    return retval;
}